

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O0

void __thiscall
soul::SanityCheckPass::PostResolutionChecks::visit(PostResolutionChecks *this,IfStatement *i)

{
  Expression *pEVar1;
  CompileMessage local_50;
  IfStatement *local_18;
  IfStatement *i_local;
  PostResolutionChecks *this_local;
  
  local_18 = i;
  i_local = (IfStatement *)this;
  if ((i->isConstIf & 1U) != 0) {
    pEVar1 = pool_ref<soul::AST::Expression>::operator->(&i->condition);
    Errors::expectedConstant<>();
    AST::Context::throwError(&(pEVar1->super_Statement).super_ASTObject.context,&local_50,false);
  }
  ASTVisitor::visit(&this->super_ASTVisitor,i);
  return;
}

Assistant:

void visit (AST::IfStatement& i) override
        {
            if (i.isConstIf)
                i.condition->context.throwError (Errors::expectedConstant());

            super::visit (i);
        }